

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O2

int CheckCompressBig1(void)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  undefined4 uStack_20;
  
  uVar1 = CalcFib(0);
  iVar4 = (AlphabetSize - 1) * uVar1;
  for (bVar3 = 1; bVar3 < AlphabetSize; bVar3 = bVar3 + 1) {
    uVar1 = CalcFib((uint)bVar3);
    iVar4 = iVar4 + (AlphabetSize - bVar3) * uVar1;
  }
  if (AlphabetSize == 0x10) {
    uStack_20 = 0x15;
  }
  else if (AlphabetSize == 0x15) {
    uStack_20 = 0x1a;
  }
  else if (AlphabetSize == 0x1a) {
    uStack_20 = 0x1f;
  }
  else if (AlphabetSize == 0x1f) {
    uStack_20 = 0x23;
  }
  else {
    uStack_20 = 0x29;
  }
  iVar2 = AlphabetSize * 10;
  AlphabetSize = uStack_20;
  iVar4 = CheckCompress((ulong)((iVar2 + iVar4 + 7U >> 3) + 4));
  return iVar4;
}

Assistant:

static int CheckCompressBig1(void) {
    unsigned bits = CalcFib(0)*(AlphabetSize-1);
    for (unsigned char c = 1; c < AlphabetSize; ++c) {
        bits += CalcFib(c)*(AlphabetSize-c);
    }
    int expectedLength = 4+(10*AlphabetSize+bits+7)/8;
    AlphabetSize = AlphabetSize == 16 ? 21
        : AlphabetSize == 21 ? 26
        : AlphabetSize == 26 ? 31
        : AlphabetSize == 31 ? 35
        : AlphabetSize == 35 ? 41
        : 41;
    return CheckCompress(expectedLength);
}